

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

bool __thiscall
cmDepends::Check(cmDepends *this,char *makeFile,char *internalFile,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                *validDeps)

{
  int iVar1;
  bool bVar2;
  allocator local_271;
  string local_270;
  cmWorkingDirectory workdir;
  ifstream fin;
  byte abStack_210 [488];
  
  cmWorkingDirectory::cmWorkingDirectory(&workdir,&this->CompileDirectory);
  std::ifstream::ifstream(&fin,internalFile,_S_in);
  if ((abStack_210[*(long *)(_fin + -0x18)] & 5) == 0) {
    iVar1 = (*this->_vptr_cmDepends[3])(this,&fin,internalFile,validDeps);
    bVar2 = true;
    if ((char)iVar1 != '\0') goto LAB_00408ec3;
  }
  Clear(this,makeFile);
  std::__cxx11::string::string((string *)&local_270,internalFile,&local_271);
  cmsys::SystemTools::RemoveFile(&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  bVar2 = false;
LAB_00408ec3:
  std::ifstream::~ifstream(&fin);
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return bVar2;
}

Assistant:

bool cmDepends::Check(const char* makeFile, const char* internalFile,
                      std::map<std::string, DependencyVector>& validDeps)
{
  // Dependency checks must be done in proper working directory.
  cmWorkingDirectory workdir(this->CompileDirectory);

  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile);
  if (!(fin && this->CheckDependencies(fin, internalFile, validDeps))) {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    okay = false;
  }

  return okay;
}